

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O3

MeasureUnit * __thiscall icu_63::MeasureUnit::operator=(MeasureUnit *this,MeasureUnit *other)

{
  int32_t iVar1;
  
  if (this != other) {
    iVar1 = other->fSubTypeId;
    this->fTypeId = other->fTypeId;
    this->fSubTypeId = iVar1;
    strcpy(this->fCurrency,other->fCurrency);
  }
  return this;
}

Assistant:

MeasureUnit &MeasureUnit::operator=(const MeasureUnit &other) {
    if (this == &other) {
        return *this;
    }
    fTypeId = other.fTypeId;
    fSubTypeId = other.fSubTypeId;
    uprv_strcpy(fCurrency, other.fCurrency);
    return *this;
}